

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int __thiscall ixxx::posix::open(posix *this,char *__file,int __oflag,...)

{
  int iVar1;
  open_error *this_00;
  int *piVar2;
  int r;
  mode_t mode_local;
  int flags_local;
  char *pathname_local;
  
  iVar1 = ::open((char *)this,(int)__file,(ulong)(uint)__oflag);
  if (iVar1 == -1) {
    this_00 = (open_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    open_error::sys_error(this_00,*piVar2,(char *)0x0,ERRNO);
    __cxa_throw(this_00,&open_error::typeinfo,open_error::~open_error);
  }
  return iVar1;
}

Assistant:

int open(const char *pathname, int flags, mode_t mode)
    {
      int r = ::open(pathname, flags
#if (defined(__MINGW32__) || defined(__MINGW64__))
          | _O_BINARY
#endif
          , mode);
      if (r == -1)
        throw open_error(errno);
      return r;
    }